

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::generateSyntheticAnnotation
          (TraverseSchema *this,DOMElement *elem,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  _func_int **pp_Var2;
  bool bVar3;
  XMLCh toAppend;
  int iVar4;
  undefined4 extraout_var;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *this_01;
  DOMNode **ppDVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar6;
  TraverseSchema *pTVar7;
  XMLCh *pXVar8;
  DOMElement *pDVar9;
  undefined4 extraout_var_04;
  XSAnnotation *this_02;
  undefined1 *p;
  bool bVar10;
  XMLSize_t i;
  XMLSize_t getAt;
  long lVar11;
  uint local_5c;
  DOMElement *local_58;
  TraverseSchema *local_50;
  XMLCh *local_48;
  DOMElement *local_40;
  long local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  local_58 = elem;
  iVar4 = (*(elem->super_DOMNode)._vptr_DOMNode[0x17])(elem);
  pXVar8 = (XMLCh *)CONCAT44(extraout_var,iVar4);
  this_01 = (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,this->fMemoryManager);
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::ValueHashTableOf
            (this_01,0x1d,this->fMemoryManager);
  this_00 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  local_50 = this;
  XMLBuffer::append(this_00,L'<');
  if (pXVar8 != (XMLCh *)0x0) {
    XMLBuffer::append(this_00,pXVar8);
    XMLBuffer::append(this_00,L':');
  }
  p = SchemaSymbols::fgELT_ANNOTATION;
  local_48 = pXVar8;
  XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
  XVar1 = nonXSAttList->fCurCount;
  for (getAt = 0; XVar1 != getAt; getAt = getAt + 1) {
    ppDVar5 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,getAt);
    pTVar7 = (TraverseSchema *)*ppDVar5;
    XMLBuffer::append(this_00,L' ');
    iVar4 = (*(*(_func_int ***)pTVar7)[2])(pTVar7);
    XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_00,iVar4));
    XMLBuffer::append(this_00,L'=');
    XMLBuffer::append(this_00,L'\"');
    iVar4 = (*(*(_func_int ***)pTVar7)[3])();
    processAttValue(pTVar7,(XMLCh *)CONCAT44(extraout_var_01,iVar4),this_00);
    p = (undefined1 *)0x22;
    XMLBuffer::append(this_00,L'\"');
  }
  bVar10 = false;
  pDVar9 = local_58;
  do {
    local_40 = pDVar9;
    iVar4 = (*(pDVar9->super_DOMNode)._vptr_DOMNode[0xb])(pDVar9);
    plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
    local_38 = (**(code **)(*plVar6 + 0x28))(plVar6);
    for (lVar11 = 0; local_38 != lVar11; lVar11 = lVar11 + 1) {
      pTVar7 = (TraverseSchema *)(**(code **)(*plVar6 + 0x18))(plVar6,lVar11);
      pXVar8 = (XMLCh *)(**(code **)(*(long *)pTVar7 + 0x10))(pTVar7);
      p = XMLUni::fgXMLNSColonString;
      bVar3 = XMLString::startsWith(pXVar8,(XMLCh *)XMLUni::fgXMLNSColonString);
      if (bVar3) {
        p = (undefined1 *)pXVar8;
        bVar3 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                          (this_01,pXVar8);
        if (!bVar3) {
          local_5c = 0;
          ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put(this_01,pXVar8,&local_5c);
LAB_00310a86:
          XMLBuffer::append(this_00,L' ');
          XMLBuffer::append(this_00,pXVar8);
          XMLBuffer::append(this_00,L'=');
          XMLBuffer::append(this_00,L'\"');
          pXVar8 = (XMLCh *)(**(code **)(*(long *)pTVar7 + 0x18))();
          processAttValue(pTVar7,pXVar8,this_00);
          p = (undefined1 *)0x22;
          XMLBuffer::append(this_00,L'\"');
        }
      }
      else {
        bVar3 = !bVar10;
        bVar10 = true;
        if (bVar3) {
          p = XMLUni::fgXMLNSString;
          bVar3 = XMLString::equals(pXVar8,(XMLCh *)XMLUni::fgXMLNSString);
          bVar10 = true;
          if (bVar3) goto LAB_00310a86;
          bVar10 = false;
        }
      }
    }
    iVar4 = (*(local_40->super_DOMNode)._vptr_DOMNode[5])();
    pDVar9 = (DOMElement *)CONCAT44(extraout_var_03,iVar4);
    iVar4 = (*(local_50->fSchemaInfo->fSchemaRootElement->super_DOMNode)._vptr_DOMNode[5])();
    if (pDVar9 == (DOMElement *)CONCAT44(extraout_var_04,iVar4)) {
      ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(this_01);
      XMemory::operator_delete((XMemory *)this_01,p);
      XMLBuffer::append(this_00,L'>');
      XMLBuffer::append(this_00,L'\n');
      XMLBuffer::append(this_00,L'<');
      pXVar8 = local_48;
      pTVar7 = local_50;
      if (local_48 == (XMLCh *)0x0) {
        XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
        XMLBuffer::append(this_00,L'>');
        XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
        XMLBuffer::append(this_00,L'<');
        toAppend = L'/';
      }
      else {
        XMLBuffer::append(this_00,local_48);
        XMLBuffer::append(this_00,L':');
        XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
        XMLBuffer::append(this_00,L'>');
        XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
        XMLBuffer::append(this_00,L'<');
        XMLBuffer::append(this_00,L'/');
        XMLBuffer::append(this_00,pXVar8);
        toAppend = L':';
      }
      XMLBuffer::append(this_00,toAppend);
      XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
      XMLBuffer::append(this_00,L'>');
      XMLBuffer::append(this_00,L'\n');
      XMLBuffer::append(this_00,L'<');
      XMLBuffer::append(this_00,L'/');
      if (pXVar8 != (XMLCh *)0x0) {
        XMLBuffer::append(this_00,pXVar8);
        XMLBuffer::append(this_00,L':');
      }
      XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
      XMLBuffer::append(this_00,L'>');
      this_02 = (XSAnnotation *)XMemory::operator_new(0x58,pTVar7->fGrammarPoolMemoryManager);
      pXVar8 = (pTVar7->fBuffer).fBuffer;
      pXVar8[(pTVar7->fBuffer).fIndex] = L'\0';
      XSAnnotation::XSAnnotation(this_02,pXVar8,pTVar7->fGrammarPoolMemoryManager);
      pp_Var2 = local_58[0x17].super_DOMNode._vptr_DOMNode;
      this_02->fLine = (XMLFileLoc)local_58[0x16].super_DOMNode._vptr_DOMNode;
      this_02->fCol = (XMLFileLoc)pp_Var2;
      XSAnnotation::setSystemId(this_02,pTVar7->fSchemaInfo->fCurrentSchemaURL);
      return this_02;
    }
  } while( true );
}

Assistant:

XSAnnotation* TraverseSchema::generateSyntheticAnnotation(const DOMElement* const elem
                                             , ValueVectorOf<DOMNode*>* nonXSAttList)
{
    const XMLCh* prefix = elem->getPrefix();
    ValueHashTableOf<unsigned int>* listOfURIs = new (fMemoryManager) ValueHashTableOf<unsigned int>(29, fMemoryManager);
    bool sawXMLNS = false;

    fBuffer.reset();
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);

    // next is the nonXSAttList names & values
    XMLSize_t nonXSAttSize = nonXSAttList->size();

    for (XMLSize_t i=0; i<nonXSAttSize; i++)
    {
        DOMNode* attNode = nonXSAttList->elementAt(i);

        fBuffer.append(chSpace);
        fBuffer.append(attNode->getNodeName());
        fBuffer.append(chEqual);
        fBuffer.append(chDoubleQuote);
        processAttValue(attNode->getNodeValue(), fBuffer);
        fBuffer.append(chDoubleQuote);
    }

    // next is the namespaces on the elem
    DOMElement* currentElem = (DOMElement*) elem;
    DOMNamedNodeMap* eltAttrs;
    XMLSize_t     attrCount;
    do {
        eltAttrs = currentElem->getAttributes();
        attrCount = eltAttrs->getLength();
        for (XMLSize_t j = 0; j < attrCount; j++)
        {
            DOMNode*     attribute = eltAttrs->item(j);
            const XMLCh* attName = attribute->getNodeName();

            if (XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            {
                if (!listOfURIs->containsKey((void*) attName)) {
                    listOfURIs->put((void*) attName, 0);
                    fBuffer.append(chSpace);
                    fBuffer.append(attName);
                    fBuffer.append(chEqual);
                    fBuffer.append(chDoubleQuote);
                    processAttValue(attribute->getNodeValue(), fBuffer);
                    fBuffer.append(chDoubleQuote);
                }
            }
            else if (!sawXMLNS && XMLString::equals(attName, XMLUni::fgXMLNSString))
            {
                fBuffer.append(chSpace);
                fBuffer.append(attName);
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attribute->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
                sawXMLNS = true;
            }
        }
        currentElem = (DOMElement*) currentElem->getParentNode();
    }
    while (currentElem != fSchemaInfo->getRoot()->getParentNode());
    delete listOfURIs;

    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(fgSynthetic_Annotation);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);
    fBuffer.append(chCloseAngle);

    XSAnnotation* annot = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
    annot->setLineCol( ((XSDElementNSImpl*)elem)->getLineNo()
                     , ((XSDElementNSImpl*)elem)->getColumnNo() );
    annot->setSystemId(fSchemaInfo->getCurrentSchemaURL());
    return annot;
}